

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,yaml_char_t *value,size_t length)

{
  yaml_char_t *pyVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  
  if (emitter->whitespace == 0) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
      return 0;
    }
    pyVar1 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar1 + 1;
    *pyVar1 = ' ';
    emitter->column = emitter->column + 1;
  }
  if (length != 0) {
    pbVar5 = value + length;
    do {
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      bVar3 = *value;
      if ((char)bVar3 < '\0') {
        if ((bVar3 & 0xe0) == 0xc0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[1];
          value = value + 2;
          goto LAB_001077ee;
        }
        if ((bVar3 & 0xf0) == 0xe0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[1];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[2];
          value = value + 3;
          goto LAB_001077ee;
        }
        if ((bVar3 & 0xf8) == 0xf0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[1];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[2];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = value[3];
          value = value + 4;
          goto LAB_001077ee;
        }
      }
      else {
        value = value + 1;
LAB_001077ee:
        pbVar2 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar2 + 1;
        *pbVar2 = bVar3;
      }
      emitter->column = emitter->column + 1;
    } while (value != pbVar5);
  }
  emitter->whitespace = 0;
  emitter->indention = 0;
  return 1;
}

Assistant:

static int
yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (!emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}